

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

UniquePtr<BIGNUM> BIGNUMPow2(uint bit)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  int in_ESI;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true> this;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_20;
  UniquePtr<BIGNUM> bn;
  uint bit_local;
  
  this.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  this.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_4_ = bit;
  bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = in_ESI;
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_20,(pointer)pBVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
    iVar2 = BN_set_bit(pBVar3,bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_);
    if (iVar2 != 0) {
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                 this.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,&local_20);
      goto LAB_001d72bc;
    }
  }
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)
             this.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(nullptr_t)0x0);
LAB_001d72bc:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<bignum_st_*,_bssl::internal::Deleter>)
         this.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<BIGNUM> BIGNUMPow2(unsigned bit) {
  bssl::UniquePtr<BIGNUM> bn(BN_new());
  if (!bn ||  //
      !BN_set_bit(bn.get(), bit)) {
    return nullptr;
  }
  return bn;
}